

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O0

void __thiscall discordpp::SelectOption::SelectOption(SelectOption *this,SelectOption *param_1)

{
  SelectOption *param_1_local;
  SelectOption *this_local;
  
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->label,&param_1->label);
  field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::field
            (&this->value,&param_1->value);
  omittable_field<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::omittable_field(&this->description,&param_1->description);
  omittable_field<discordpp::Emoji>::omittable_field(&this->emoji,&param_1->emoji);
  omittable_field<bool>::omittable_field(&this->default_selected,&param_1->default_selected);
  return;
}

Assistant:

SelectOption(
        field<std::string> label = uninitialized,
        field<std::string> value = uninitialized,
        omittable_field<std::string> description = omitted,
        omittable_field<Emoji> emoji = omitted,
        omittable_field<bool> default_selected = omitted
    ):
        label(label),
        value(value),
        description(description),
        emoji(emoji),
        default_selected(default_selected)
    {}